

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_prop_down.h
# Opt level: O0

void __thiscall
mp::
ConstraintPropagatorsDown<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
::PropagateResult<mp::AlgebraicExpression<mp::QuadAndLinTerms>>
          (ConstraintPropagatorsDown<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *this,ComplementarityConstraint<mp::AlgebraicExpression<mp::QuadAndLinTerms>_> *con)

{
  double unaff_retaddr;
  double in_stack_00000008;
  ComplementarityConstraint<mp::AlgebraicExpression<mp::QuadAndLinTerms>_> *in_stack_00000010;
  ConstraintPropagatorsDown<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_stack_00000018;
  Context in_stack_00000024;
  Context local_14 [5];
  
  BasicFlatConverter::MinusInfty();
  BasicFlatConverter::Infty();
  Context::Context(local_14,CTX_MIX);
  PropagateResult<mp::AlgebraicExpression<mp::QuadAndLinTerms>>
            (in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr,in_stack_00000024);
  return;
}

Assistant:

void PropagateResult(ComplementarityConstraint<ExprBody>& con) {
    MPD( PropagateResult(con,
                         MPD(MinusInfty()), MPD(Infty()), Context::CTX_MIX) );
  }